

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Set_tiled_proc_grid(int g_a,int *block,int *proc_grid)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int i_1;
  int i;
  Integer _proc_grid [7];
  Integer _block [7];
  Integer ndim;
  Integer aa;
  int local_b0;
  int local_ac;
  long local_a8;
  Integer *in_stack_ffffffffffffff60;
  Integer *in_stack_ffffffffffffff68;
  Integer in_stack_ffffffffffffff70;
  long local_68 [8];
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_20 = (long)in_EDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = pnga_get_dimension(local_20);
  for (local_ac = 0; local_ac < local_28; local_ac = local_ac + 1) {
    local_68[(local_28 - local_ac) + -1] = (long)*(int *)(local_10 + (long)local_ac * 4);
  }
  for (local_b0 = 0; local_b0 < local_28; local_b0 = local_b0 + 1) {
    (&local_a8)[(local_28 - local_b0) + -1] = (long)*(int *)(local_18 + (long)local_b0 * 4);
  }
  pnga_set_tiled_proc_grid
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  return;
}

Assistant:

void NGA_Set_tiled_proc_grid(int g_a, int block[], int proc_grid[])
{
    Integer aa, ndim;
    Integer _block[MAXDIM];
    Integer _proc_grid[MAXDIM];
    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    COPYC2F(block,_block, ndim);
    COPYC2F(proc_grid, _proc_grid, ndim);
    wnga_set_tiled_proc_grid(aa, _block, _proc_grid);
}